

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_test_control(int op,...)

{
  sqlite3_mutex **ppsVar1;
  ushort uVar2;
  sqlite3 *db;
  _func_int_void_ptr_void_ptr *p_Var3;
  int *piVar4;
  char in_AL;
  byte bVar5;
  LogEst LVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  u32 uVar11;
  Bitvec *pBVar12;
  void *p;
  void *pBuf;
  u64 x_00;
  int *in_RCX;
  ulong uVar13;
  uint uVar14;
  u64 *in_RDX;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  sqlite3 *in_RSI;
  sqlite3PrngType *__src;
  sqlite3PrngType *__dest;
  undefined8 in_R8;
  undefined8 in_R9;
  double in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int iStack_130;
  va_list ap;
  int x;
  Bitvec *local_100;
  void *local_f8;
  ulong local_f0;
  sqlite3 *local_e0;
  _func_int_void_ptr_void_ptr *local_d8;
  int *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  double local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  p_Var3 = local_d8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  uVar15 = 0;
  if (0x1c < op - 5U) {
    return 0;
  }
  local_e0._0_4_ = (u32)in_RSI;
  uVar11 = (u32)local_e0;
  db = local_e0;
  uVar7 = 0;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  switch(op) {
  case 5:
    __dest = &sqlite3SavedPrng;
    __src = &sqlite3Prng;
    goto LAB_001561d9;
  case 6:
    __dest = &sqlite3Prng;
    __src = &sqlite3SavedPrng;
LAB_001561d9:
    local_e0 = in_RSI;
    local_d8 = (_func_int_void_ptr_void_ptr *)in_RDX;
    memcpy(__dest,__src,0x84);
    uVar7 = uVar15;
    break;
  case 8:
    local_f0 = (ulong)in_RSI & 0xffffffff;
    local_e0 = in_RSI;
    local_d8 = (_func_int_void_ptr_void_ptr *)in_RDX;
    pBVar12 = sqlite3BitvecCreate(uVar11);
    p = sqlite3MallocZero((long)((int)(uVar11 + 7) / 8 + 1));
    pBuf = sqlite3_malloc64(0x200);
    uVar15 = 0xffffffff;
    local_100 = pBVar12;
    if ((pBuf != (void *)0x0 && pBVar12 != (Bitvec *)0x0) && p != (void *)0x0) {
      uVar17 = 1;
      sqlite3BitvecSet((Bitvec *)0x0,1);
      local_f8 = pBuf;
      sqlite3BitvecClear((Bitvec *)0x0,1,pBuf);
      x = 0;
      uVar15 = 0;
      do {
        while( true ) {
          pBVar12 = local_100;
          uVar13 = (ulong)uVar15;
          uVar7 = *(uint *)(p_Var3 + uVar13 * 4);
          if ((uVar7 - 1 < 2) || (uVar7 == 5)) {
            x = *(int *)(p_Var3 + uVar13 * 4 + 8) - 1;
            *(int *)(p_Var3 + uVar13 * 4 + 8) =
                 *(int *)(p_Var3 + uVar13 * 4 + 8) + *(int *)(p_Var3 + uVar13 * 4 + 0xc);
            iStack_130 = 4;
          }
          else {
            if (uVar7 == 0) {
              iVar8 = (int)local_f0;
              iVar9 = sqlite3BitvecTest(local_100,iVar8 + 1);
              iVar10 = sqlite3BitvecTest(pBVar12,0);
              uVar11 = pBVar12->iSize;
              iVar16 = 0;
              if (0 < iVar8) {
                iVar16 = iVar8;
              }
              while ((uVar7 = (uint)uVar17, pBuf = local_f8,
                     uVar15 = (iVar9 - iVar8) + iVar10 + uVar11, x = uVar7, uVar7 - iVar16 != 1 &&
                     (bVar5 = *(byte *)((long)p + (uVar17 >> 3)),
                     uVar14 = sqlite3BitvecTest(local_100,uVar7), pBuf = local_f8, uVar15 = uVar7,
                     ((bVar5 >> (uVar7 & 7) & 1) != 0) == uVar14))) {
                uVar17 = (ulong)(uVar7 + 1);
              }
              goto LAB_00156983;
            }
            sqlite3_randomness(4,&x);
            iStack_130 = 2;
          }
          if (1 < *(int *)(p_Var3 + uVar13 * 4 + 4)) {
            iStack_130 = 0;
          }
          *(int *)(p_Var3 + uVar13 * 4 + 4) = *(int *)(p_Var3 + uVar13 * 4 + 4) + -1;
          uVar15 = iStack_130 + uVar15;
          x = (int)((long)((ulong)(uint)x & 0xffffffff7fffffff) % (long)(int)local_f0);
          uVar14 = x + 1;
          uVar13 = (ulong)(uVar14 >> 3);
          bVar5 = (byte)(1 << ((byte)uVar14 & 7));
          if ((uVar7 & 1) != 0) break;
          *(byte *)((long)p + uVar13) = *(byte *)((long)p + uVar13) & ~bVar5;
          sqlite3BitvecClear(local_100,uVar14,local_f8);
        }
        *(byte *)((long)p + uVar13) = *(byte *)((long)p + uVar13) | bVar5;
      } while ((uVar7 == 5) || (iVar8 = sqlite3BitvecSet(local_100,uVar14), iVar8 == 0));
      pBuf = local_f8;
      uVar15 = 0xffffffff;
    }
LAB_00156983:
    sqlite3_free(pBuf);
    sqlite3_free(p);
    sqlite3BitvecDestroy(local_100);
    return uVar15;
  case 9:
    sqlite3Config.xTestCallback = (_func_int_int *)local_e0;
    uVar7 = uVar15;
    if (local_e0 != (sqlite3 *)0x0) {
      local_e0 = in_RSI;
      local_d8 = (_func_int_void_ptr_void_ptr *)in_RDX;
      uVar7 = (*(code *)db)(0);
    }
    break;
  case 10:
    sqlite3Hooks_1 = local_d8;
    uVar7 = uVar15;
    sqlite3Hooks_0 = in_RSI;
    break;
  case 0xb:
    uVar7 = sqlite3PendingByte;
    if ((u32)local_e0 != 0) {
      uVar7 = sqlite3PendingByte;
      sqlite3PendingByte = (u32)local_e0;
    }
    break;
  case 0xc:
    uVar7 = 0;
    break;
  case 0xd:
    uVar7 = (u32)local_e0;
    break;
  case 0xf:
    in_RSI->dbOptFlags = (u32)local_d8;
    uVar7 = uVar15;
    break;
  case 0x11:
    local_e0->mDbFlags = local_e0->mDbFlags ^ 0x20;
    uVar7 = uVar15;
    break;
  case 0x12:
    sqlite3Config.bLocaltimeFault = (u32)local_e0;
    if ((u32)local_e0 == 2) {
      sqlite3Config.xAltLocaltime = local_d8;
      uVar7 = uVar15;
    }
    else {
      sqlite3Config.xAltLocaltime = (_func_int_void_ptr_void_ptr *)0x0;
      uVar7 = uVar15;
    }
    break;
  case 0x13:
    sqlite3Config.iOnceResetThreshold = (u32)local_e0;
    uVar7 = uVar15;
    break;
  case 0x14:
    sqlite3Config.neverCorrupt = (u32)local_e0;
    uVar7 = uVar15;
    break;
  case 0x16:
    uVar7 = 0x1e212;
    break;
  case 0x17:
    uVar7 = (uint)(sqlite3Config.isInit == 0);
    break;
  case 0x18:
    in_RSI->nMaxSorterMmap = (u32)local_d8;
    uVar7 = uVar15;
    break;
  case 0x19:
    ppsVar1 = &local_e0->mutex;
    local_e0 = in_RSI;
    local_d8 = (_func_int_void_ptr_void_ptr *)in_RDX;
    if (*ppsVar1 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(*ppsVar1);
    }
    iVar8 = sqlite3FindDbName(db,(char *)local_d8);
    if (-1 < iVar8) {
      (db->init).iDb = (u8)iVar8;
      (db->init).field_0x6 = (db->init).field_0x6 & 0xfd | ((byte)local_d0 & 1) * '\x02';
      (db->init).busy = (byte)local_d0 & 1;
      (db->init).newTnum = (Pgno)local_c8;
      if ((((ulong)local_d0 & 1) == 0) && ((Pgno)local_c8 != 0)) {
        sqlite3ResetAllSchemasOfConnection(db);
      }
    }
    uVar7 = uVar15;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
    break;
  case 0x1b:
    uVar2 = *(ushort *)((long)&local_e0->pVfs->pNext + 4);
    uVar7 = uVar15;
    if ((uVar2 & 4) != 0) {
      *(ushort *)((long)&local_e0->pVfs->pNext + 4) = uVar2 & 0xffdb | 0x20;
    }
    break;
  case 0x1c:
    sqlite3Config.iPrngSeed = (u32)local_e0;
    if ((local_d8 != (_func_int_void_ptr_void_ptr *)0x0) &&
       (**(uint **)(*(long *)(local_d8 + 0x20) + 0x18) != 0)) {
      sqlite3Config.iPrngSeed = **(uint **)(*(long *)(local_d8 + 0x20) + 0x18);
    }
    local_e0 = in_RSI;
    local_d8 = (_func_int_void_ptr_void_ptr *)in_RDX;
    sqlite3_randomness(0,(void *)0x0);
    uVar7 = 0;
    break;
  case 0x1d:
    local_e0._0_1_ = (u8)in_RSI;
    sqlite3Config.bExtraSchemaChecks = (u8)local_e0;
    uVar7 = uVar15;
    break;
  case 0x1e:
    *(undefined8 *)local_d8 = 0;
    uVar7 = uVar15;
    break;
  case 0x1f:
    uVar7 = uVar15;
    switch((ulong)in_RSI & 0xffffffff) {
    case 0:
      uVar11 = sqlite3TreeTrace;
      goto LAB_00156963;
    case 1:
      sqlite3TreeTrace = *(u32 *)local_d8;
      break;
    case 2:
      uVar11 = sqlite3WhereTrace;
LAB_00156963:
      *(u32 *)local_d8 = uVar11;
      break;
    case 3:
      sqlite3WhereTrace = *(u32 *)local_d8;
    }
    break;
  case 0x21:
    local_e0 = in_RSI;
    local_d8 = (_func_int_void_ptr_void_ptr *)in_RDX;
    LVar6 = sqlite3LogEstFromDouble(local_b8);
    piVar4 = local_d0;
    p_Var3 = local_d8;
    *(int *)&local_e0->pVfs = (int)LVar6;
    x_00 = sqlite3LogEstToInt(LVar6);
    *(u64 *)p_Var3 = x_00;
    LVar6 = sqlite3LogEst(x_00);
    *piVar4 = (int)LVar6;
    uVar7 = uVar15;
  }
  return uVar7;
}

Assistant:

SQLITE_API int sqlite3_test_control(int op, ...){
  int rc = 0;
#ifdef SQLITE_UNTESTABLE
  UNUSED_PARAMETER(op);
#else
  va_list ap;
  va_start(ap, op);
  switch( op ){

    /*
    ** Save the current state of the PRNG.
    */
    case SQLITE_TESTCTRL_PRNG_SAVE: {
      sqlite3PrngSaveState();
      break;
    }

    /*
    ** Restore the state of the PRNG to the last state saved using
    ** PRNG_SAVE.  If PRNG_SAVE has never before been called, then
    ** this verb acts like PRNG_RESET.
    */
    case SQLITE_TESTCTRL_PRNG_RESTORE: {
      sqlite3PrngRestoreState();
      break;
    }

    /*  sqlite3_test_control(SQLITE_TESTCTRL_PRNG_SEED, int x, sqlite3 *db);
    **
    ** Control the seed for the pseudo-random number generator (PRNG) that
    ** is built into SQLite.  Cases:
    **
    **    x!=0 && db!=0       Seed the PRNG to the current value of the
    **                        schema cookie in the main database for db, or
    **                        x if the schema cookie is zero.  This case
    **                        is convenient to use with database fuzzers
    **                        as it allows the fuzzer some control over the
    **                        the PRNG seed.
    **
    **    x!=0 && db==0       Seed the PRNG to the value of x.
    **
    **    x==0 && db==0       Revert to default behavior of using the
    **                        xRandomness method on the primary VFS.
    **
    ** This test-control also resets the PRNG so that the new seed will
    ** be used for the next call to sqlite3_randomness().
    */
#ifndef SQLITE_OMIT_WSD
    case SQLITE_TESTCTRL_PRNG_SEED: {
      int x = va_arg(ap, int);
      int y;
      sqlite3 *db = va_arg(ap, sqlite3*);
      assert( db==0 || db->aDb[0].pSchema!=0 );
      if( db && (y = db->aDb[0].pSchema->schema_cookie)!=0 ){ x = y; }
      sqlite3Config.iPrngSeed = x;
      sqlite3_randomness(0,0);
      break;
    }
#endif

    /*
    **  sqlite3_test_control(BITVEC_TEST, size, program)
    **
    ** Run a test against a Bitvec object of size.  The program argument
    ** is an array of integers that defines the test.  Return -1 on a
    ** memory allocation error, 0 on success, or non-zero for an error.
    ** See the sqlite3BitvecBuiltinTest() for additional information.
    */
    case SQLITE_TESTCTRL_BITVEC_TEST: {
      int sz = va_arg(ap, int);
      int *aProg = va_arg(ap, int*);
      rc = sqlite3BitvecBuiltinTest(sz, aProg);
      break;
    }

    /*
    **  sqlite3_test_control(FAULT_INSTALL, xCallback)
    **
    ** Arrange to invoke xCallback() whenever sqlite3FaultSim() is called,
    ** if xCallback is not NULL.
    **
    ** As a test of the fault simulator mechanism itself, sqlite3FaultSim(0)
    ** is called immediately after installing the new callback and the return
    ** value from sqlite3FaultSim(0) becomes the return from
    ** sqlite3_test_control().
    */
    case SQLITE_TESTCTRL_FAULT_INSTALL: {
      /* A bug in MSVC prevents it from understanding pointers to functions
      ** types in the second argument to va_arg().  Work around the problem
      ** using a typedef.
      ** http://support.microsoft.com/kb/47961  <-- dead hyperlink
      ** Search at http://web.archive.org/ to find the 2015-03-16 archive
      ** of the link above to see the original text.
      ** sqlite3GlobalConfig.xTestCallback = va_arg(ap, int(*)(int));
      */
      typedef int(*sqlite3FaultFuncType)(int);
      sqlite3GlobalConfig.xTestCallback = va_arg(ap, sqlite3FaultFuncType);
      rc = sqlite3FaultSim(0);
      break;
    }

    /*
    **  sqlite3_test_control(BENIGN_MALLOC_HOOKS, xBegin, xEnd)
    **
    ** Register hooks to call to indicate which malloc() failures
    ** are benign.
    */
    case SQLITE_TESTCTRL_BENIGN_MALLOC_HOOKS: {
      typedef void (*void_function)(void);
      void_function xBenignBegin;
      void_function xBenignEnd;
      xBenignBegin = va_arg(ap, void_function);
      xBenignEnd = va_arg(ap, void_function);
      sqlite3BenignMallocHooks(xBenignBegin, xBenignEnd);
      break;
    }

    /*
    **  sqlite3_test_control(SQLITE_TESTCTRL_PENDING_BYTE, unsigned int X)
    **
    ** Set the PENDING byte to the value in the argument, if X>0.
    ** Make no changes if X==0.  Return the value of the pending byte
    ** as it existing before this routine was called.
    **
    ** IMPORTANT:  Changing the PENDING byte from 0x40000000 results in
    ** an incompatible database file format.  Changing the PENDING byte
    ** while any database connection is open results in undefined and
    ** deleterious behavior.
    */
    case SQLITE_TESTCTRL_PENDING_BYTE: {
      rc = PENDING_BYTE;
#ifndef SQLITE_OMIT_WSD
      {
        unsigned int newVal = va_arg(ap, unsigned int);
        if( newVal ) sqlite3PendingByte = newVal;
      }
#endif
      break;
    }

    /*
    **  sqlite3_test_control(SQLITE_TESTCTRL_ASSERT, int X)
    **
    ** This action provides a run-time test to see whether or not
    ** assert() was enabled at compile-time.  If X is true and assert()
    ** is enabled, then the return value is true.  If X is true and
    ** assert() is disabled, then the return value is zero.  If X is
    ** false and assert() is enabled, then the assertion fires and the
    ** process aborts.  If X is false and assert() is disabled, then the
    ** return value is zero.
    */
    case SQLITE_TESTCTRL_ASSERT: {
      volatile int x = 0;
      assert( /*side-effects-ok*/ (x = va_arg(ap,int))!=0 );
      rc = x;
#if defined(SQLITE_DEBUG)
      /* Invoke these debugging routines so that the compiler does not
      ** issue "defined but not used" warnings. */
      if( x==9999 ){
        sqlite3ShowExpr(0);
        sqlite3ShowExpr(0);
        sqlite3ShowExprList(0);
        sqlite3ShowIdList(0);
        sqlite3ShowSrcList(0);
        sqlite3ShowWith(0);
        sqlite3ShowUpsert(0);
        sqlite3ShowTriggerStep(0);
        sqlite3ShowTriggerStepList(0);
        sqlite3ShowTrigger(0);
        sqlite3ShowTriggerList(0);
#ifndef SQLITE_OMIT_WINDOWFUNC
        sqlite3ShowWindow(0);
        sqlite3ShowWinFunc(0);
#endif
        sqlite3ShowSelect(0);
      }
#endif
      break;
    }


    /*
    **  sqlite3_test_control(SQLITE_TESTCTRL_ALWAYS, int X)
    **
    ** This action provides a run-time test to see how the ALWAYS and
    ** NEVER macros were defined at compile-time.
    **
    ** The return value is ALWAYS(X) if X is true, or 0 if X is false.
    **
    ** The recommended test is X==2.  If the return value is 2, that means
    ** ALWAYS() and NEVER() are both no-op pass-through macros, which is the
    ** default setting.  If the return value is 1, then ALWAYS() is either
    ** hard-coded to true or else it asserts if its argument is false.
    ** The first behavior (hard-coded to true) is the case if
    ** SQLITE_TESTCTRL_ASSERT shows that assert() is disabled and the second
    ** behavior (assert if the argument to ALWAYS() is false) is the case if
    ** SQLITE_TESTCTRL_ASSERT shows that assert() is enabled.
    **
    ** The run-time test procedure might look something like this:
    **
    **    if( sqlite3_test_control(SQLITE_TESTCTRL_ALWAYS, 2)==2 ){
    **      // ALWAYS() and NEVER() are no-op pass-through macros
    **    }else if( sqlite3_test_control(SQLITE_TESTCTRL_ASSERT, 1) ){
    **      // ALWAYS(x) asserts that x is true. NEVER(x) asserts x is false.
    **    }else{
    **      // ALWAYS(x) is a constant 1.  NEVER(x) is a constant 0.
    **    }
    */
    case SQLITE_TESTCTRL_ALWAYS: {
      int x = va_arg(ap,int);
      rc = x ? ALWAYS(x) : 0;
      break;
    }

    /*
    **   sqlite3_test_control(SQLITE_TESTCTRL_BYTEORDER);
    **
    ** The integer returned reveals the byte-order of the computer on which
    ** SQLite is running:
    **
    **       1     big-endian,    determined at run-time
    **      10     little-endian, determined at run-time
    **  432101     big-endian,    determined at compile-time
    **  123410     little-endian, determined at compile-time
    */
    case SQLITE_TESTCTRL_BYTEORDER: {
      rc = SQLITE_BYTEORDER*100 + SQLITE_LITTLEENDIAN*10 + SQLITE_BIGENDIAN;
      break;
    }

    /*  sqlite3_test_control(SQLITE_TESTCTRL_OPTIMIZATIONS, sqlite3 *db, int N)
    **
    ** Enable or disable various optimizations for testing purposes.  The
    ** argument N is a bitmask of optimizations to be disabled.  For normal
    ** operation N should be 0.  The idea is that a test program (like the
    ** SQL Logic Test or SLT test module) can run the same SQL multiple times
    ** with various optimizations disabled to verify that the same answer
    ** is obtained in every case.
    */
    case SQLITE_TESTCTRL_OPTIMIZATIONS: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      db->dbOptFlags = va_arg(ap, u32);
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_LOCALTIME_FAULT, onoff, xAlt);
    **
    ** If parameter onoff is 1, subsequent calls to localtime() fail.
    ** If 2, then invoke xAlt() instead of localtime().  If 0, normal
    ** processing.
    **
    ** xAlt arguments are void pointers, but they really want to be:
    **
    **    int xAlt(const time_t*, struct tm*);
    **
    ** xAlt should write results in to struct tm object of its 2nd argument
    ** and return zero on success, or return non-zero on failure.
    */
    case SQLITE_TESTCTRL_LOCALTIME_FAULT: {
      sqlite3GlobalConfig.bLocaltimeFault = va_arg(ap, int);
      if( sqlite3GlobalConfig.bLocaltimeFault==2 ){
        typedef int(*sqlite3LocaltimeType)(const void*,void*);
        sqlite3GlobalConfig.xAltLocaltime = va_arg(ap, sqlite3LocaltimeType);
      }else{
        sqlite3GlobalConfig.xAltLocaltime = 0;
      }
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_INTERNAL_FUNCTIONS, sqlite3*);
    **
    ** Toggle the ability to use internal functions on or off for
    ** the database connection given in the argument.
    */
    case SQLITE_TESTCTRL_INTERNAL_FUNCTIONS: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      db->mDbFlags ^= DBFLAG_InternalFunc;
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_NEVER_CORRUPT, int);
    **
    ** Set or clear a flag that indicates that the database file is always well-
    ** formed and never corrupt.  This flag is clear by default, indicating that
    ** database files might have arbitrary corruption.  Setting the flag during
    ** testing causes certain assert() statements in the code to be activated
    ** that demonstrat invariants on well-formed database files.
    */
    case SQLITE_TESTCTRL_NEVER_CORRUPT: {
      sqlite3GlobalConfig.neverCorrupt = va_arg(ap, int);
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_EXTRA_SCHEMA_CHECKS, int);
    **
    ** Set or clear a flag that causes SQLite to verify that type, name,
    ** and tbl_name fields of the sqlite_schema table.  This is normally
    ** on, but it is sometimes useful to turn it off for testing.
    **
    ** 2020-07-22:  Disabling EXTRA_SCHEMA_CHECKS also disables the
    ** verification of rootpage numbers when parsing the schema.  This
    ** is useful to make it easier to reach strange internal error states
    ** during testing.  The EXTRA_SCHEMA_CHECKS setting is always enabled
    ** in production.
    */
    case SQLITE_TESTCTRL_EXTRA_SCHEMA_CHECKS: {
      sqlite3GlobalConfig.bExtraSchemaChecks = va_arg(ap, int);
      break;
    }

    /* Set the threshold at which OP_Once counters reset back to zero.
    ** By default this is 0x7ffffffe (over 2 billion), but that value is
    ** too big to test in a reasonable amount of time, so this control is
    ** provided to set a small and easily reachable reset value.
    */
    case SQLITE_TESTCTRL_ONCE_RESET_THRESHOLD: {
      sqlite3GlobalConfig.iOnceResetThreshold = va_arg(ap, int);
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_VDBE_COVERAGE, xCallback, ptr);
    **
    ** Set the VDBE coverage callback function to xCallback with context
    ** pointer ptr.
    */
    case SQLITE_TESTCTRL_VDBE_COVERAGE: {
#ifdef SQLITE_VDBE_COVERAGE
      typedef void (*branch_callback)(void*,unsigned int,
                                      unsigned char,unsigned char);
      sqlite3GlobalConfig.xVdbeBranch = va_arg(ap,branch_callback);
      sqlite3GlobalConfig.pVdbeBranchArg = va_arg(ap,void*);
#endif
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_SORTER_MMAP, db, nMax); */
    case SQLITE_TESTCTRL_SORTER_MMAP: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      db->nMaxSorterMmap = va_arg(ap, int);
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_ISINIT);
    **
    ** Return SQLITE_OK if SQLite has been initialized and SQLITE_ERROR if
    ** not.
    */
    case SQLITE_TESTCTRL_ISINIT: {
      if( sqlite3GlobalConfig.isInit==0 ) rc = SQLITE_ERROR;
      break;
    }

    /*  sqlite3_test_control(SQLITE_TESTCTRL_IMPOSTER, db, dbName, onOff, tnum);
    **
    ** This test control is used to create imposter tables.  "db" is a pointer
    ** to the database connection.  dbName is the database name (ex: "main" or
    ** "temp") which will receive the imposter.  "onOff" turns imposter mode on
    ** or off.  "tnum" is the root page of the b-tree to which the imposter
    ** table should connect.
    **
    ** Enable imposter mode only when the schema has already been parsed.  Then
    ** run a single CREATE TABLE statement to construct the imposter table in
    ** the parsed schema.  Then turn imposter mode back off again.
    **
    ** If onOff==0 and tnum>0 then reset the schema for all databases, causing
    ** the schema to be reparsed the next time it is needed.  This has the
    ** effect of erasing all imposter tables.
    */
    case SQLITE_TESTCTRL_IMPOSTER: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      int iDb;
      sqlite3_mutex_enter(db->mutex);
      iDb = sqlite3FindDbName(db, va_arg(ap,const char*));
      if( iDb>=0 ){
        db->init.iDb = iDb;
        db->init.busy = db->init.imposterTable = va_arg(ap,int);
        db->init.newTnum = va_arg(ap,int);
        if( db->init.busy==0 && db->init.newTnum>0 ){
          sqlite3ResetAllSchemasOfConnection(db);
        }
      }
      sqlite3_mutex_leave(db->mutex);
      break;
    }

#if defined(YYCOVERAGE)
    /*  sqlite3_test_control(SQLITE_TESTCTRL_PARSER_COVERAGE, FILE *out)
    **
    ** This test control (only available when SQLite is compiled with
    ** -DYYCOVERAGE) writes a report onto "out" that shows all
    ** state/lookahead combinations in the parser state machine
    ** which are never exercised.  If any state is missed, make the
    ** return code SQLITE_ERROR.
    */
    case SQLITE_TESTCTRL_PARSER_COVERAGE: {
      FILE *out = va_arg(ap, FILE*);
      if( sqlite3ParserCoverage(out) ) rc = SQLITE_ERROR;
      break;
    }
#endif /* defined(YYCOVERAGE) */

    /*  sqlite3_test_control(SQLITE_TESTCTRL_RESULT_INTREAL, sqlite3_context*);
    **
    ** This test-control causes the most recent sqlite3_result_int64() value
    ** to be interpreted as a MEM_IntReal instead of as an MEM_Int.  Normally,
    ** MEM_IntReal values only arise during an INSERT operation of integer
    ** values into a REAL column, so they can be challenging to test.  This
    ** test-control enables us to write an intreal() SQL function that can
    ** inject an intreal() value at arbitrary places in an SQL statement,
    ** for testing purposes.
    */
    case SQLITE_TESTCTRL_RESULT_INTREAL: {
      sqlite3_context *pCtx = va_arg(ap, sqlite3_context*);
      sqlite3ResultIntReal(pCtx);
      break;
    }

    /*  sqlite3_test_control(SQLITE_TESTCTRL_SEEK_COUNT,
    **    sqlite3 *db,    // Database connection
    **    u64 *pnSeek     // Write seek count here
    **  );
    **
    ** This test-control queries the seek-counter on the "main" database
    ** file.  The seek-counter is written into *pnSeek and is then reset.
    ** The seek-count is only available if compiled with SQLITE_DEBUG.
    */
    case SQLITE_TESTCTRL_SEEK_COUNT: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      u64 *pn = va_arg(ap, sqlite3_uint64*);
      *pn = sqlite3BtreeSeekCount(db->aDb->pBt);
      (void)db;  /* Silence harmless unused variable warning */
      break;
    }

    /*  sqlite3_test_control(SQLITE_TESTCTRL_TRACEFLAGS, op, ptr)
    **
    **  "ptr" is a pointer to a u32.
    **
    **   op==0       Store the current sqlite3TreeTrace in *ptr
    **   op==1       Set sqlite3TreeTrace to the value *ptr
    **   op==3       Store the current sqlite3WhereTrace in *ptr
    **   op==3       Set sqlite3WhereTrace to the value *ptr
    */
    case SQLITE_TESTCTRL_TRACEFLAGS: {
       int opTrace = va_arg(ap, int);
       u32 *ptr = va_arg(ap, u32*);
       switch( opTrace ){
         case 0:   *ptr = sqlite3TreeTrace;      break;
         case 1:   sqlite3TreeTrace = *ptr;      break;
         case 2:   *ptr = sqlite3WhereTrace;     break;
         case 3:   sqlite3WhereTrace = *ptr;     break;
       }
       break;
    }

    /* sqlite3_test_control(SQLITE_TESTCTRL_LOGEST,
    **      double fIn,     // Input value
    **      int *pLogEst,   // sqlite3LogEstFromDouble(fIn)
    **      u64 *pInt,      // sqlite3LogEstToInt(*pLogEst)
    **      int *pLogEst2   // sqlite3LogEst(*pInt)
    ** );
    **
    ** Test access for the LogEst conversion routines.
    */
    case SQLITE_TESTCTRL_LOGEST: {
      double rIn = va_arg(ap, double);
      LogEst rLogEst = sqlite3LogEstFromDouble(rIn);
      int *pI1 = va_arg(ap,int*);
      u64 *pU64 = va_arg(ap,u64*);
      int *pI2 = va_arg(ap,int*);
      *pI1 = rLogEst;
      *pU64 = sqlite3LogEstToInt(rLogEst);
      *pI2 = sqlite3LogEst(*pU64);
      break;
    }


#if defined(SQLITE_DEBUG) && !defined(SQLITE_OMIT_WSD)
    /* sqlite3_test_control(SQLITE_TESTCTRL_TUNE, id, *piValue)
    **
    ** If "id" is an integer between 1 and SQLITE_NTUNE then set the value
    ** of the id-th tuning parameter to *piValue.  If "id" is between -1
    ** and -SQLITE_NTUNE, then write the current value of the (-id)-th
    ** tuning parameter into *piValue.
    **
    ** Tuning parameters are for use during transient development builds,
    ** to help find the best values for constants in the query planner.
    ** Access tuning parameters using the Tuning(ID) macro.  Set the
    ** parameters in the CLI using ".testctrl tune ID VALUE".
    **
    ** Transient use only.  Tuning parameters should not be used in
    ** checked-in code.
    */
    case SQLITE_TESTCTRL_TUNE: {
      int id = va_arg(ap, int);
      int *piValue = va_arg(ap, int*);
      if( id>0 && id<=SQLITE_NTUNE ){
        Tuning(id) = *piValue;
      }else if( id<0 && id>=-SQLITE_NTUNE ){
        *piValue = Tuning(-id);
      }else{
        rc = SQLITE_NOTFOUND;
      }
      break;
    }
#endif
  }
  va_end(ap);
#endif /* SQLITE_UNTESTABLE */
  return rc;
}